

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void google::protobuf::compiler::objectivec::anon_unknown_12::SetCommonFieldVariables
               (FieldDescriptor *descriptor,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  pointer *this;
  byte bVar1;
  bool bVar2;
  int x;
  Type TVar3;
  DescriptorStringView psVar4;
  Descriptor *pDVar5;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar6;
  FieldObjCTypeOptions options;
  FieldDescriptor *in_RDX;
  Descriptor *descriptor_00;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *in_R8;
  string_view name;
  byte local_69a;
  AlphaNum local_560;
  AlphaNum local_530;
  AlphaNum local_500;
  AlphaNum local_4d0;
  AlphaNum local_4a0;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  allocator<char> local_3e9;
  value_type local_3e8;
  byte local_3c2;
  allocator<char> local_3c1;
  undefined1 local_3c0 [6];
  bool clear_on_zero;
  allocator<char> local_399;
  value_type local_398;
  allocator<char> local_371;
  value_type local_370;
  allocator<char> local_349;
  value_type local_348;
  allocator<char> local_321;
  value_type local_320;
  allocator<char> local_2f9;
  value_type local_2f8;
  allocator<char> local_2d1;
  value_type local_2d0;
  allocator<char> local_2a9;
  value_type local_2a8;
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_flags;
  string local_250;
  string local_230;
  string local_210;
  AlphaNum local_1f0;
  string local_1c0;
  AlphaNum local_1a0;
  AlphaNum local_170;
  AlphaNum local_140;
  undefined1 local_110 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  string *capitalized_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  string *classname;
  undefined8 uStack_98;
  bool needs_custom_name;
  undefined8 local_90;
  undefined1 local_88 [8];
  string un_camel_case_name;
  undefined1 local_58 [8];
  string raw_field_name;
  string camel_case_name;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldDescriptor *descriptor_local;
  
  FieldName_abi_cxx11_
            ((string *)((long)&raw_field_name.field_2 + 8),(objectivec *)descriptor,in_RDX);
  std::__cxx11::string::string((string *)local_58);
  bVar1 = google::protobuf::internal::cpp::IsGroupLike(descriptor);
  if ((bVar1 & 1) == 0) {
    psVar4 = FieldDescriptor::name_abi_cxx11_(descriptor);
    std::__cxx11::string::operator=((string *)local_58,(string *)psVar4);
  }
  else {
    pDVar5 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    psVar4 = Descriptor::name_abi_cxx11_(pDVar5);
    std::__cxx11::string::operator=((string *)local_58,(string *)psVar4);
  }
  _uStack_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(raw_field_name.field_2._M_local_buf + 8));
  name._M_len = uStack_98._8_8_;
  name._M_str = (char *)descriptor;
  UnCamelCaseFieldName_abi_cxx11_((string *)local_88,uStack_98,name,in_R8);
  classname._7_1_ =
       std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_88);
  pDVar5 = FieldDescriptor::containing_type(descriptor);
  ClassName_abi_cxx11_((string *)&capitalized_name,(objectivec *)pDVar5,descriptor_00);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&capitalized_name;
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[10]> *)0x6b7e3b);
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&capitalized_name);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[5]> *)0x6b980f);
  std::__cxx11::string::operator=
            ((string *)pbVar6,(string *)(raw_field_name.field_2._M_local_buf + 8));
  FieldNameCapitalized_abi_cxx11_((string *)(local_110 + 0x20),(objectivec *)descriptor,field);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_110 + 0x20)
  ;
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[17]> *)0x649438);
  std::__cxx11::string::operator=((string *)pbVar6,(string *)(local_110 + 0x20));
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[15],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[15]> *)"raw_field_name");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)local_58);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_140,local_a8);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_170,"_FieldNumber_");
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_1a0,local_d0);
  options = (FieldObjCTypeOptions)&local_1a0;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_110,&local_140,&local_170);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[18],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[18]> *)"field_number_name");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)local_110);
  std::__cxx11::string::~string((string *)local_110);
  x = FieldDescriptor::number(descriptor);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_1f0,x);
  absl::lts_20240722::StrCat_abi_cxx11_(&local_1c0,(lts_20240722 *)&local_1f0,a);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[13],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[13]> *)0x61fa94);
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  FieldObjCType_abi_cxx11_(&local_210,(objectivec *)descriptor,(FieldDescriptor *)0x6,options);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[14]> *)"property_type");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  FieldObjCType_abi_cxx11_(&local_230,(objectivec *)descriptor,(FieldDescriptor *)0x7,options);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[13],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[13]> *)"storage_type");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  GetCapitalizedType_abi_cxx11_(&local_250,(objectivec *)descriptor,field_00);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[11]> *)0x649410);
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  GetOptionalDeprecatedAttribute<google::protobuf::FieldDescriptor>
            ((string *)
             &field_flags.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,descriptor,(FileDescriptor *)0x0);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[21],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[21]> *)0x69209f);
  this = &field_flags.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::operator=((string *)pbVar6,(string *)this);
  std::__cxx11::string::~string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_288);
  bVar2 = FieldDescriptor::is_repeated(descriptor);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"GPBFieldRepeated",&local_2a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
  }
  bVar1 = google::protobuf::FieldDescriptor::is_required();
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"GPBFieldRequired",&local_2d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
  }
  bVar2 = FieldDescriptor::is_optional(descriptor);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"GPBFieldOptional",&local_2f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
  }
  bVar1 = google::protobuf::FieldDescriptor::is_packed();
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"GPBFieldPacked",&local_321);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
  }
  bVar2 = FieldDescriptor::has_default_value(descriptor);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"GPBFieldHasDefaultValue",&local_349);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
  }
  if ((classname._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"GPBFieldTextFormatNameCustom",&local_371);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
  }
  TVar3 = FieldDescriptor::type(descriptor);
  if (TVar3 == TYPE_ENUM) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"GPBFieldHasEnumDescriptor",&local_399);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    google::protobuf::FieldDescriptor::enum_type();
    bVar1 = google::protobuf::EnumDescriptor::is_closed();
    if ((bVar1 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3c0,"GPBFieldClosedEnum",&local_3c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288,(value_type *)local_3c0);
      std::__cxx11::string::~string((string *)local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
    }
  }
  bVar2 = FieldDescriptor::is_repeated(descriptor);
  local_69a = 0;
  if (!bVar2) {
    local_69a = google::protobuf::FieldDescriptor::has_presence();
    local_69a = local_69a ^ 0xff;
  }
  local_3c2 = local_69a & 1;
  if (local_3c2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"GPBFieldClearHasIvarOnZero",&local_3e9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
  }
  BuildFlagsString(&local_410,FLAGTYPE_FIELD,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_288);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[11]> *)"fieldflags");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  DefaultValue_abi_cxx11_(&local_430,(objectivec *)descriptor,field_01);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[8],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[8]> *)0x69c486);
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  GPBGenericValueFieldName_abi_cxx11_(&local_450,(objectivec *)descriptor,field_02);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[13],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[13]> *)"default_name");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[22],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[22]> *)"dataTypeSpecific_name");
  std::__cxx11::string::operator=((string *)pbVar6,"clazz");
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[23]> *)"dataTypeSpecific_value");
  std::__cxx11::string::operator=((string *)pbVar6,"Nil");
  absl::lts_20240722::AlphaNum::AlphaNum(&local_4a0,"(uint32_t)offsetof(");
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_4d0,local_a8);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_500,"__storage_, ");
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_530,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&raw_field_name.field_2 + 8));
  absl::lts_20240722::AlphaNum::AlphaNum(&local_560,")");
  absl::lts_20240722::StrCat<>(&local_470,&local_4a0,&local_4d0,&local_500,&local_530,&local_560);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[21],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[21]> *)"storage_offset_value");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[23]> *)"storage_offset_comment");
  std::__cxx11::string::operator=((string *)pbVar6,"");
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[18],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[18]> *)0x69c87c);
  std::__cxx11::string::operator=((string *)pbVar6,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_288);
  std::__cxx11::string::~string((string *)(local_110 + 0x20));
  std::__cxx11::string::~string((string *)&capitalized_name);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(raw_field_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void SetCommonFieldVariables(
    const FieldDescriptor* descriptor,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  std::string camel_case_name = FieldName(descriptor);
  std::string raw_field_name;
  if (internal::cpp::IsGroupLike(*descriptor)) {
    raw_field_name = descriptor->message_type()->name();
  } else {
    raw_field_name = descriptor->name();
  }
  // The logic here has to match -[GGPBFieldDescriptor textFormatName].
  const std::string un_camel_case_name(
      UnCamelCaseFieldName(camel_case_name, descriptor));
  const bool needs_custom_name = (raw_field_name != un_camel_case_name);

  const std::string& classname = ClassName(descriptor->containing_type());
  (*variables)["classname"] = classname;
  (*variables)["name"] = camel_case_name;
  const std::string& capitalized_name = FieldNameCapitalized(descriptor);
  (*variables)["capitalized_name"] = capitalized_name;
  (*variables)["raw_field_name"] = raw_field_name;
  (*variables)["field_number_name"] =
      absl::StrCat(classname, "_FieldNumber_", capitalized_name);
  (*variables)["field_number"] = absl::StrCat(descriptor->number());
  (*variables)["property_type"] = FieldObjCType(
      descriptor, static_cast<FieldObjCTypeOptions>(
                      kFieldObjCTypeOptions_IncludeSpaceAfterBasicTypes |
                      kFieldObjCTypeOptions_IncludeSpaceBeforeStar));
  (*variables)["storage_type"] = FieldObjCType(
      descriptor, static_cast<FieldObjCTypeOptions>(
                      kFieldObjCTypeOptions_IncludeSpaceAfterBasicTypes |
                      kFieldObjCTypeOptions_OmitLightweightGenerics |
                      kFieldObjCTypeOptions_IncludeSpaceBeforeStar));
  (*variables)["field_type"] = GetCapitalizedType(descriptor);
  (*variables)["deprecated_attribute"] =
      GetOptionalDeprecatedAttribute(descriptor);
  std::vector<std::string> field_flags;
  if (descriptor->is_repeated()) field_flags.push_back("GPBFieldRepeated");
  if (descriptor->is_required()) field_flags.push_back("GPBFieldRequired");
  if (descriptor->is_optional()) field_flags.push_back("GPBFieldOptional");
  if (descriptor->is_packed()) field_flags.push_back("GPBFieldPacked");

  // ObjC custom flags.
  if (descriptor->has_default_value())
    field_flags.push_back("GPBFieldHasDefaultValue");
  if (needs_custom_name) field_flags.push_back("GPBFieldTextFormatNameCustom");
  if (descriptor->type() == FieldDescriptor::TYPE_ENUM) {
    field_flags.push_back("GPBFieldHasEnumDescriptor");
    if (descriptor->enum_type()->is_closed()) {
      field_flags.push_back("GPBFieldClosedEnum");
    }
  }
  // It will clear on a zero value if...
  //  - not repeated/map
  //  - doesn't have presence
  bool clear_on_zero =
      (!descriptor->is_repeated() && !descriptor->has_presence());
  if (clear_on_zero) {
    field_flags.push_back("GPBFieldClearHasIvarOnZero");
  }

  (*variables)["fieldflags"] = BuildFlagsString(FLAGTYPE_FIELD, field_flags);

  (*variables)["default"] = DefaultValue(descriptor);
  (*variables)["default_name"] = GPBGenericValueFieldName(descriptor);

  (*variables)["dataTypeSpecific_name"] = "clazz";
  (*variables)["dataTypeSpecific_value"] = "Nil";

  (*variables)["storage_offset_value"] = absl::StrCat(
      "(uint32_t)offsetof(", classname, "__storage_, ", camel_case_name, ")");
  (*variables)["storage_offset_comment"] = "";

  // Clear some common things so they can be set just when needed.
  (*variables)["storage_attribute"] = "";
}